

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webvttparser.cc
# Opt level: O3

int libwebvtt::Parser::ParseNumber(string *line,size_type *idx_ptr)

{
  uint uVar1;
  pointer pcVar2;
  int iVar3;
  ulong uVar4;
  int iVar5;
  
  if (((idx_ptr != (size_type *)0x0) && (uVar4 = *idx_ptr, uVar4 != 0xffffffffffffffff)) &&
     (uVar4 < line->_M_string_length)) {
    pcVar2 = (line->_M_dataplus)._M_p;
    iVar5 = (int)pcVar2[uVar4];
    uVar1 = iVar5 - 0x30;
    if (uVar1 < 10) {
      iVar3 = 0;
      while ((uVar4 = uVar4 + 1, iVar3 < 0xccccccd && (iVar3 * 10 <= -0x7fffffd1 - iVar5))) {
        iVar3 = uVar1 + iVar3 * 10;
        *idx_ptr = uVar4;
        iVar5 = (int)pcVar2[uVar4];
        uVar1 = iVar5 - 0x30;
        if (9 < uVar1) {
          return iVar3;
        }
      }
    }
  }
  return -1;
}

Assistant:

int Parser::ParseNumber(const std::string& line,
                        std::string::size_type* idx_ptr) {
  if (idx_ptr == NULL)
    return -1;

  std::string::size_type& idx = *idx_ptr;

  if (idx == std::string::npos || idx >= line.length())
    return -1;

  if (!isdigit(line[idx]))
    return -1;

  int result = 0;

  while (isdigit(line[idx])) {
    const char c = line[idx];
    const int i = c - '0';

    if (result > INT_MAX / 10)
      return -1;

    result *= 10;

    if (result > INT_MAX - i)
      return -1;

    result += i;

    ++idx;
  }

  return result;
}